

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O0

bool __thiscall wabt::Type::IsRef(Type *this)

{
  bool local_11;
  Type *this_local;
  
  local_11 = true;
  if ((((this->enum_ != Anyref) && (local_11 = true, this->enum_ != Funcref)) &&
      (local_11 = true, this->enum_ != Nullref)) && (local_11 = true, this->enum_ != Exnref)) {
    local_11 = this->enum_ == Hostref;
  }
  return local_11;
}

Assistant:

bool IsRef() const {
    return enum_ == Type::Anyref || enum_ == Type::Funcref ||
           enum_ == Type::Nullref || enum_ == Type::Exnref ||
           enum_ == Type::Hostref;
  }